

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O0

uhugeint_t
duckdb::DecimalAddOverflowCheck::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t left,uhugeint_t right)

{
  uhugeint_t left_00;
  uhugeint_t params_1;
  uhugeint_t params;
  bool bVar1;
  undefined8 uVar2;
  uint64_t in_RCX;
  uint64_t in_RDX;
  uint64_t in_RDI;
  uhugeint_t result;
  uhugeint_t *in_stack_ffffffffffffff80;
  uhugeint_t in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff98;
  OutOfRangeException *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  uhugeint_t local_10;
  
  left_00.upper = (uint64_t)in_stack_ffffffffffffffa0;
  left_00.lower = (uint64_t)in_stack_ffffffffffffff98;
  bVar1 = TryDecimalAdd::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (left_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff90,
               "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
               ,(allocator *)&stack0xffffffffffffff8f);
    params.upper = in_RDI;
    params.lower = in_RCX;
    params_1.upper = in_RDX;
    params_1.lower = in_stack_ffffffffffffffa8;
    OutOfRangeException::OutOfRangeException<duckdb::uhugeint_t,duckdb::uhugeint_t>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,params,params_1);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return local_10;
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalAdd::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}